

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall llama_model::llama_model(llama_model *this,llama_model_params *params)

{
  impl *piVar1;
  long lVar2;
  llama_model_params *plVar3;
  llama_model_params *plVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  byte bVar7;
  
  bVar7 = 0;
  this->type = LLM_TYPE_UNKNOWN;
  this->arch = LLM_ARCH_UNKNOWN;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name,"n/a","");
  (this->hparams).n_embd_features = 0;
  (this->hparams).n_layer = 0;
  (this->hparams).n_rot = 0;
  (this->hparams).n_swa = 0;
  (this->hparams).vocab_only = false;
  (this->hparams).rope_finetuned = false;
  (this->hparams).use_par_res = false;
  (this->hparams).swin_norm = false;
  (this->hparams).n_ctx_train = 0;
  (this->hparams).n_embd = 0;
  (this->hparams).n_embd_features = 0;
  (this->hparams).n_swa_pattern = 1;
  memset(&(this->hparams).n_embd_head_k,0,0x184d);
  (this->hparams).expert_gating_func = 0;
  (this->hparams).f_norm_eps = 0.0;
  (this->hparams).f_norm_rms_eps = 0.0;
  (this->hparams).f_norm_group_eps = 0.0;
  (this->hparams).f_attn_logit_softcapping = 50.0;
  (this->hparams).f_final_logit_softcapping = 30.0;
  (this->hparams).rescale_every_n_layers = 0;
  (this->hparams).time_mix_extra_dim = 0;
  (this->hparams).time_decay_extra_dim = 0;
  (this->hparams).wkv_head_size = 0;
  (this->hparams).token_shift_count = 2;
  (this->hparams).n_lora_decay = 0;
  (this->hparams).n_lora_iclr = 0;
  (this->hparams).n_lora_value_res_mix = 0;
  (this->hparams).n_lora_gate = 0;
  (this->hparams).rope_attn_factor = 1.0;
  (this->hparams).rope_freq_base_train = 0.0;
  (this->hparams).rope_freq_base_train_swa = 0.0;
  (this->hparams).rope_freq_scale_train = 0.0;
  (this->hparams).rope_freq_scale_train_swa = 0.0;
  (this->hparams).n_ctx_orig_yarn = 0;
  (this->hparams).rope_yarn_log_mul = 0.0;
  (this->hparams).rope_sections._M_elems[0] = 0;
  (this->hparams).rope_sections._M_elems[1] = 0;
  (this->hparams).rope_sections._M_elems[2] = 0;
  (this->hparams).rope_sections._M_elems[3] = 0;
  (this->hparams).ssm_d_conv = 0;
  (this->hparams).ssm_d_inner = 0;
  *(undefined8 *)((long)&(this->hparams).ssm_d_conv + 1) = 0;
  *(undefined8 *)((long)&(this->hparams).ssm_d_state + 1) = 0;
  (this->hparams).f_clamp_kqv = 0.0;
  (this->hparams).f_max_alibi_bias = 0.0;
  (this->hparams).f_logit_scale = 0.0;
  (this->hparams).f_residual_scale = 0.0;
  (this->hparams).f_embedding_scale = 0.0;
  (this->hparams).f_attention_scale = 0.0;
  (this->hparams).causal_attn = true;
  (this->hparams).use_alibi = false;
  (this->hparams).attn_soft_cap = false;
  (this->hparams).n_moe_layer_step = 0;
  (this->hparams).use_kq_norm = true;
  (this->hparams).n_attn_chunk = 0;
  (this->hparams).n_no_rope_layer_step = 4;
  (this->hparams).n_attn_temp_floor_scale = 0x2000;
  (this->hparams).f_attn_temp_scale = 0.1;
  (this->hparams).dec_start_token_id = -1;
  (this->hparams).pooling_type = LLAMA_POOLING_TYPE_NONE;
  (this->hparams).rope_type = LLAMA_ROPE_TYPE_NONE;
  (this->hparams).rope_scaling_type_train = LLAMA_ROPE_SCALING_TYPE_NONE;
  llama_vocab::llama_vocab(&this->vocab);
  memset(&this->tok_embd,0,0x98);
  plVar3 = params;
  plVar4 = &this->params;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    plVar4->devices = plVar3->devices;
    plVar3 = (llama_model_params *)((long)plVar3 + (ulong)bVar7 * -0x10 + 8);
    plVar4 = (llama_model_params *)((long)plVar4 + (ulong)bVar7 * -0x10 + 8);
  }
  (this->gguf_kv)._M_h._M_buckets = &(this->gguf_kv)._M_h._M_single_bucket;
  (this->gguf_kv)._M_h._M_bucket_count = 1;
  (this->gguf_kv)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->gguf_kv)._M_h._M_element_count = 0;
  (this->gguf_kv)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->gguf_kv)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->gguf_kv)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->devices).super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->devices).super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->devices).super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tensors_by_name).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tensors_by_name).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tensors_by_name).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->t_load_us = 0;
  this->t_start_us = 0;
  piVar1 = (impl *)operator_new(0x130);
  piVar1->n_elements = 0;
  piVar1->n_bytes = 0;
  (piVar1->desc_str)._M_dataplus._M_p = (pointer)&(piVar1->desc_str).field_2;
  bVar6 = false;
  (piVar1->desc_str)._M_string_length = 0;
  (piVar1->desc_str).field_2._M_local_buf[0] = '\0';
  p_Var5 = (_Base_ptr)((long)&(piVar1->gpu_buft_list)._M_t + 8);
  (((_Rb_tree_header *)((long)&(piVar1->gpu_buft_list)._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(piVar1->gpu_buft_list)._M_t + 0x10) = (_Base_ptr)0x0;
  memset(&piVar1->mappings,0,0x90);
  *(_Base_ptr *)((long)&(piVar1->gpu_buft_list)._M_t + 0x18) = p_Var5;
  *(_Base_ptr *)((long)&(piVar1->gpu_buft_list)._M_t + 0x20) = p_Var5;
  *(size_t *)((long)&(piVar1->gpu_buft_list)._M_t + 0x28) = 0;
  (piVar1->dev_input).dev = (ggml_backend_dev_t)0x0;
  (piVar1->dev_input).buft_list = (buft_list_t *)0x0;
  (piVar1->dev_output).dev = (ggml_backend_dev_t)0x0;
  (piVar1->dev_output).buft_list = (buft_list_t *)0x0;
  *(undefined8 *)
   &(piVar1->dev_layer).
    super__Vector_base<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>.
    _M_impl = 0;
  *(pointer *)
   ((long)&(piVar1->dev_layer).
           super__Vector_base<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(piVar1->dev_layer).
           super__Vector_base<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>
   + 0x10) = (pointer)0x0;
  (this->pimpl)._M_t.
  super___uniq_ptr_impl<llama_model::impl,_std::default_delete<llama_model::impl>_>._M_t.
  super__Tuple_impl<0UL,_llama_model::impl_*,_std::default_delete<llama_model::impl>_>.
  super__Head_base<0UL,_llama_model::impl_*,_false>._M_head_impl = piVar1;
  if (params->tensor_buft_overrides != (llama_model_tensor_buft_override *)0x0) {
    bVar6 = params->tensor_buft_overrides->pattern != (char *)0x0;
  }
  piVar1->has_tensor_overrides = bVar6;
  return;
}

Assistant:

llama_model::llama_model(const llama_model_params & params) : params(params), pimpl(std::make_unique<impl>()) {
    pimpl->has_tensor_overrides = params.tensor_buft_overrides && params.tensor_buft_overrides[0].pattern;
}